

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O3

void * evthread_posix_cond_alloc(uint condflags)

{
  int iVar1;
  pthread_cond_t *__cond;
  
  __cond = (pthread_cond_t *)event_mm_malloc_(0x30);
  if (__cond != (pthread_cond_t *)0x0) {
    iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar1 == 0) {
      return __cond;
    }
    event_mm_free_(__cond);
  }
  return (void *)0x0;
}

Assistant:

static void *
evthread_posix_cond_alloc(unsigned condflags)
{
	pthread_cond_t *cond = mm_malloc(sizeof(pthread_cond_t));
	if (!cond)
		return NULL;
	if (pthread_cond_init(cond, NULL)) {
		mm_free(cond);
		return NULL;
	}
	return cond;
}